

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3WhereEnd(WhereInfo *pWInfo)

{
  int iVar1;
  Parse *pParse;
  SrcList *pSVar2;
  sqlite3 *db;
  Vdbe *p;
  Table *pTVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  Op *pOVar7;
  int iVar8;
  u8 *puVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  WhereLevel *pWVar13;
  
  pParse = pWInfo->pParse;
  pSVar2 = pWInfo->pTabList;
  db = pParse->db;
  p = pParse->pVdbe;
  sqlite3ExprCacheClear(pParse);
  lVar12 = (long)pWInfo->nLevel;
  if (0 < lVar12) {
    do {
      pWVar13 = pWInfo->a + lVar12 + -1;
      if (p->aLabel != (int *)0x0) {
        p->aLabel[~(long)pWVar13->addrCont] = p->nOp;
      }
      if (pWVar13->op != 0x95) {
        sqlite3VdbeAddOp3(p,(uint)pWVar13->op,pWVar13->p1,pWVar13->p2,0);
        if (p->aOp != (Op *)0x0) {
          p->aOp[(long)p->nOp + -1].p5 = pWVar13->p5;
        }
      }
      if ((((pWVar13->plan).wsFlags & 0x80f1000) != 0) && (0 < (pWVar13->u).in.nIn)) {
        if (p->aLabel != (int *)0x0) {
          p->aLabel[~(long)pWVar13->addrNxt] = p->nOp;
        }
        iVar8 = (pWVar13->u).in.nIn;
        if (0 < (long)iVar8) {
          puVar9 = &(pWVar13->u).in.aInLoop[(long)iVar8 + -1].eEndLoopOp;
          iVar8 = iVar8 + 1;
          do {
            iVar6 = *(int *)(puVar9 + -4);
            if (-2 < iVar6) {
              if (iVar6 + 1U < (uint)p->nOp) {
                p->aOp[iVar6 + 1U].p2 = p->nOp;
              }
            }
            sqlite3VdbeAddOp3(p,(uint)*puVar9,((InLoop *)(puVar9 + -8))->iCur,iVar6,0);
            if (0 < *(int *)(puVar9 + -4)) {
              uVar5 = *(int *)(puVar9 + -4) - 1;
              if (uVar5 < (uint)p->nOp) {
                p->aOp[uVar5].p2 = p->nOp;
              }
            }
            puVar9 = puVar9 + -0xc;
            iVar8 = iVar8 + -1;
          } while (1 < iVar8);
        }
        sqlite3DbFree(db,(pWVar13->u).in.aInLoop);
      }
      if (p->aLabel != (int *)0x0) {
        p->aLabel[~(long)pWVar13->addrBrk] = p->nOp;
      }
      if (pWVar13->iLeftJoin != 0) {
        uVar5 = sqlite3VdbeAddOp3(p,0x78,pWVar13->iLeftJoin,0,0);
        if (((pWVar13->plan).wsFlags & 0x400000) == 0) {
          sqlite3VdbeAddOp3(p,0x42,pSVar2->a[lVar12 + -1].iCursor,0,0);
        }
        if (-1 < pWVar13->iIdxCur) {
          sqlite3VdbeAddOp3(p,0x42,pWVar13->iIdxCur,0,0);
        }
        if (pWVar13->op == '\x03') {
          iVar6 = pWVar13->addrFirst;
          iVar8 = pWVar13->p1;
          iVar10 = 2;
        }
        else {
          iVar6 = pWVar13->addrFirst;
          iVar10 = 1;
          iVar8 = 0;
        }
        sqlite3VdbeAddOp3(p,iVar10,iVar8,iVar6,0);
        if ((-1 < (int)uVar5) && (uVar5 < (uint)p->nOp)) {
          p->aOp[uVar5].p2 = p->nOp;
        }
      }
      bVar4 = 1 < lVar12;
      lVar12 = lVar12 + -1;
    } while (bVar4);
  }
  if (p->aLabel != (int *)0x0) {
    p->aLabel[~(long)pWInfo->iBreak] = p->nOp;
  }
  if (0 < pWInfo->nLevel) {
    pWVar13 = pWInfo->a;
    iVar8 = 0;
    do {
      pTVar3 = pSVar2->a[pWVar13->iFrom].pTab;
      if ((((pTVar3->tabFlags & 2) == 0) && (pTVar3->pSelect == (Select *)0x0)) &&
         ((pWInfo->wctrlFlags & 0x10) == 0)) {
        uVar5 = (pWVar13->plan).wsFlags;
        if ((uVar5 >> 0x16 & 1) == 0 && pWInfo->okOnePass == '\0') {
          sqlite3VdbeAddOp3(p,0x2d,pSVar2->a[pWVar13->iFrom].iCursor,0,0);
        }
        if (((byte)(uVar5 >> 0x1d) & 1) == 0 && (uVar5 & 0xf0000) != 0) {
          sqlite3VdbeAddOp3(p,0x2d,pWVar13->iIdxCur,0,0);
        }
      }
      uVar5 = (pWVar13->plan).wsFlags;
      lVar12 = 0x10;
      if (((uVar5 & 0xf0000) == 0) && (lVar12 = 0x40, (uVar5 >> 0x1c & 1) == 0)) {
        lVar12 = 0;
      }
      else {
        lVar12 = *(long *)((long)&(pWVar13->plan).wsFlags + lVar12);
      }
      if ((lVar12 != 0) && (db->mallocFailed == '\0')) {
        iVar6 = pWInfo->iTop;
        iVar10 = iVar6;
        if (iVar6 < 0) {
          iVar10 = p->nOp + -1;
        }
        pOVar7 = (Op *)&sqlite3VdbeGetOp_dummy;
        if (p->db->mallocFailed == '\0') {
          pOVar7 = p->aOp + iVar10;
        }
        iVar10 = p->nOp;
        if (iVar6 < iVar10) {
          iVar1 = pWVar13->iTabCur;
          do {
            if (pOVar7->p1 == iVar1) {
              if (pOVar7->opcode == 'A') {
                pOVar7->p1 = pWVar13->iIdxCur;
                pOVar7->opcode = 'c';
              }
              else if ((pOVar7->opcode == '\x1d') && ((ulong)*(ushort *)(lVar12 + 0x4c) != 0)) {
                uVar11 = 0;
                do {
                  if (pOVar7->p2 == *(int *)(*(long *)(lVar12 + 8) + uVar11 * 4)) {
                    pOVar7->p2 = (int)uVar11;
                    pOVar7->p1 = pWVar13->iIdxCur;
                    break;
                  }
                  uVar11 = uVar11 + 1;
                } while (*(ushort *)(lVar12 + 0x4c) != uVar11);
              }
            }
            iVar6 = iVar6 + 1;
            pOVar7 = pOVar7 + 1;
          } while (iVar6 != iVar10);
        }
      }
      iVar8 = iVar8 + 1;
      pWVar13 = pWVar13 + 1;
    } while (iVar8 < pWInfo->nLevel);
  }
  pParse->nQueryLoop = pWInfo->savedNQueryLoop;
  whereInfoFree(db,pWInfo);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3WhereEnd(WhereInfo *pWInfo){
  Parse *pParse = pWInfo->pParse;
  Vdbe *v = pParse->pVdbe;
  int i;
  WhereLevel *pLevel;
  SrcList *pTabList = pWInfo->pTabList;
  sqlite3 *db = pParse->db;

  /* Generate loop termination code.
  */
  sqlite3ExprCacheClear(pParse);
  for(i=pWInfo->nLevel-1; i>=0; i--){
    pLevel = &pWInfo->a[i];
    sqlite3VdbeResolveLabel(v, pLevel->addrCont);
    if( pLevel->op!=OP_Noop ){
      sqlite3VdbeAddOp2(v, pLevel->op, pLevel->p1, pLevel->p2);
      sqlite3VdbeChangeP5(v, pLevel->p5);
    }
    if( pLevel->plan.wsFlags & WHERE_IN_ABLE && pLevel->u.in.nIn>0 ){
      struct InLoop *pIn;
      int j;
      sqlite3VdbeResolveLabel(v, pLevel->addrNxt);
      for(j=pLevel->u.in.nIn, pIn=&pLevel->u.in.aInLoop[j-1]; j>0; j--, pIn--){
        sqlite3VdbeJumpHere(v, pIn->addrInTop+1);
        sqlite3VdbeAddOp2(v, pIn->eEndLoopOp, pIn->iCur, pIn->addrInTop);
        sqlite3VdbeJumpHere(v, pIn->addrInTop-1);
      }
      sqlite3DbFree(db, pLevel->u.in.aInLoop);
    }
    sqlite3VdbeResolveLabel(v, pLevel->addrBrk);
    if( pLevel->iLeftJoin ){
      int addr;
      addr = sqlite3VdbeAddOp1(v, OP_IfPos, pLevel->iLeftJoin);
      assert( (pLevel->plan.wsFlags & WHERE_IDX_ONLY)==0
           || (pLevel->plan.wsFlags & WHERE_INDEXED)!=0 );
      if( (pLevel->plan.wsFlags & WHERE_IDX_ONLY)==0 ){
        sqlite3VdbeAddOp1(v, OP_NullRow, pTabList->a[i].iCursor);
      }
      if( pLevel->iIdxCur>=0 ){
        sqlite3VdbeAddOp1(v, OP_NullRow, pLevel->iIdxCur);
      }
      if( pLevel->op==OP_Return ){
        sqlite3VdbeAddOp2(v, OP_Gosub, pLevel->p1, pLevel->addrFirst);
      }else{
        sqlite3VdbeAddOp2(v, OP_Goto, 0, pLevel->addrFirst);
      }
      sqlite3VdbeJumpHere(v, addr);
    }
  }

  /* The "break" point is here, just past the end of the outer loop.
  ** Set it.
  */
  sqlite3VdbeResolveLabel(v, pWInfo->iBreak);

  /* Close all of the cursors that were opened by sqlite3WhereBegin.
  */
  assert( pWInfo->nLevel==1 || pWInfo->nLevel==pTabList->nSrc );
  for(i=0, pLevel=pWInfo->a; i<pWInfo->nLevel; i++, pLevel++){
    Index *pIdx = 0;
    struct SrcList_item *pTabItem = &pTabList->a[pLevel->iFrom];
    Table *pTab = pTabItem->pTab;
    assert( pTab!=0 );
    if( (pTab->tabFlags & TF_Ephemeral)==0
     && pTab->pSelect==0
     && (pWInfo->wctrlFlags & WHERE_OMIT_OPEN_CLOSE)==0
    ){
      int ws = pLevel->plan.wsFlags;
      if( !pWInfo->okOnePass && (ws & WHERE_IDX_ONLY)==0 ){
        sqlite3VdbeAddOp1(v, OP_Close, pTabItem->iCursor);
      }
      if( (ws & WHERE_INDEXED)!=0 && (ws & WHERE_TEMP_INDEX)==0 ){
        sqlite3VdbeAddOp1(v, OP_Close, pLevel->iIdxCur);
      }
    }

    /* If this scan uses an index, make code substitutions to read data
    ** from the index in preference to the table. Sometimes, this means
    ** the table need never be read from. This is a performance boost,
    ** as the vdbe level waits until the table is read before actually
    ** seeking the table cursor to the record corresponding to the current
    ** position in the index.
    ** 
    ** Calls to the code generator in between sqlite3WhereBegin and
    ** sqlite3WhereEnd will have created code that references the table
    ** directly.  This loop scans all that code looking for opcodes
    ** that reference the table and converts them into opcodes that
    ** reference the index.
    */
    if( pLevel->plan.wsFlags & WHERE_INDEXED ){
      pIdx = pLevel->plan.u.pIdx;
    }else if( pLevel->plan.wsFlags & WHERE_MULTI_OR ){
      pIdx = pLevel->u.pCovidx;
    }
    if( pIdx && !db->mallocFailed){
      int k, j, last;
      VdbeOp *pOp;

      pOp = sqlite3VdbeGetOp(v, pWInfo->iTop);
      last = sqlite3VdbeCurrentAddr(v);
      for(k=pWInfo->iTop; k<last; k++, pOp++){
        if( pOp->p1!=pLevel->iTabCur ) continue;
        if( pOp->opcode==OP_Column ){
          for(j=0; j<pIdx->nColumn; j++){
            if( pOp->p2==pIdx->aiColumn[j] ){
              pOp->p2 = j;
              pOp->p1 = pLevel->iIdxCur;
              break;
            }
          }
          assert( (pLevel->plan.wsFlags & WHERE_IDX_ONLY)==0
               || j<pIdx->nColumn );
        }else if( pOp->opcode==OP_Rowid ){
          pOp->p1 = pLevel->iIdxCur;
          pOp->opcode = OP_IdxRowid;
        }
      }
    }
  }

  /* Final cleanup
  */
  pParse->nQueryLoop = pWInfo->savedNQueryLoop;
  whereInfoFree(db, pWInfo);
  return;
}